

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.cpp
# Opt level: O2

bool __thiscall cppcms::anon_unknown_0::option::matches(option *this,string *path,char *method)

{
  bool bVar1;
  
  if (this->match_method_ == 2) {
    if ((method != (char *)0x0) &&
       (bVar1 = booster::regex_match<booster::regex>(method,&this->mexpr_,0), bVar1))
    goto LAB_0020dee5;
  }
  else if ((this->match_method_ != 1) ||
          ((method != (char *)0x0 && (bVar1 = std::operator!=(&this->method_,method), !bVar1)))) {
LAB_0020dee5:
    bVar1 = booster::regex_match<booster::regex>
                      ((path->_M_dataplus)._M_p,&this->match_,&this->expr_,0);
    return bVar1;
  }
  return false;
}

Assistant:

bool matches(std::string const &path,char const *method)
			{
				if(match_method_==1) {
					if(!method || method_ != method)
						return false;
				}
				else if(match_method_ == 2) {
					if(!method || !booster::regex_match(method,mexpr_))
						return false;
				}
				
				return booster::regex_match(path.c_str(),match_,expr_);
			}